

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void FT_Done_GlyphSlot(FT_GlyphSlot slot)

{
  FT_Face pFVar1;
  FT_Memory pFVar2;
  FT_Generic_Finalizer p_Var3;
  FT_GlyphSlot pFVar4;
  FT_GlyphSlot pFVar5;
  FT_GlyphSlot *ppFVar6;
  
  if (slot != (FT_GlyphSlot)0x0) {
    pFVar1 = slot->face;
    pFVar4 = pFVar1->glyph;
    if (pFVar4 != (FT_GlyphSlot)0x0) {
      pFVar2 = (pFVar1->driver->root).memory;
      if (pFVar4 == slot) {
        pFVar5 = (FT_GlyphSlot)0x0;
      }
      else {
        do {
          pFVar5 = pFVar4;
          pFVar4 = pFVar5->next;
          if (pFVar4 == (FT_GlyphSlot)0x0) {
            return;
          }
        } while (pFVar4 != slot);
      }
      ppFVar6 = &pFVar5->next;
      if (pFVar5 == (FT_GlyphSlot)0x0) {
        ppFVar6 = &pFVar1->glyph;
      }
      *ppFVar6 = pFVar4->next;
      p_Var3 = (slot->generic).finalizer;
      if (p_Var3 != (FT_Generic_Finalizer)0x0) {
        (*p_Var3)(slot);
      }
      ft_glyphslot_done(slot);
      (*pFVar2->free)(pFVar2,slot);
      return;
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Done_GlyphSlot( FT_GlyphSlot  slot )
  {
    if ( slot )
    {
      FT_Driver     driver = slot->face->driver;
      FT_Memory     memory = driver->root.memory;
      FT_GlyphSlot  prev;
      FT_GlyphSlot  cur;


      /* Remove slot from its parent face's list */
      prev = NULL;
      cur  = slot->face->glyph;

      while ( cur )
      {
        if ( cur == slot )
        {
          if ( !prev )
            slot->face->glyph = cur->next;
          else
            prev->next = cur->next;

          /* finalize client-specific data */
          if ( slot->generic.finalizer )
            slot->generic.finalizer( slot );

          ft_glyphslot_done( slot );
          FT_FREE( slot );
          break;
        }
        prev = cur;
        cur  = cur->next;
      }
    }
  }